

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::MaterialBinding::MaterialBinding(MaterialBinding *this,MaterialBinding *param_1)

{
  nonstd::optional_lite::optional<tinyusdz::Relationship>::optional
            (&this->materialBinding,&param_1->materialBinding);
  nonstd::optional_lite::optional<tinyusdz::Relationship>::optional
            (&this->materialBindingPreview,&param_1->materialBindingPreview);
  nonstd::optional_lite::optional<tinyusdz::Relationship>::optional
            (&this->materialBindingFull,&param_1->materialBindingFull);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
  ::_Rb_tree(&(this->_materialBindingMap)._M_t,&(param_1->_materialBindingMap)._M_t);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  ::_Rb_tree(&(this->_materialBindingCollectionMap)._M_t,
             &(param_1->_materialBindingCollectionMap)._M_t);
  return;
}

Assistant:

static value::token kAllPurpose() {
    return value::token("");
  }